

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::OnDisConnect(RWSocket *this,uint16_t err)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  uint uVar2;
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  *this_01;
  element_type *this_02;
  element_type *peVar3;
  undefined1 local_68 [8];
  shared_ptr<cppnet::EventActions> actions;
  undefined1 local_48 [8];
  shared_ptr<cppnet::CppNetBase> cppnet_base;
  undefined1 local_28 [8];
  shared_ptr<cppnet::RWSocket> sock;
  uint16_t err_local;
  RWSocket *this_local;
  
  sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ =
       err;
  std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this
            ((enable_shared_from_this<cppnet::RWSocket> *)local_28);
  this_01 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
             *)Socket::__all_socket_map();
  std::
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  ::erase(this_01,&(this->super_Socket)._sock);
  uVar2 = (*(this->super_Socket)._vptr_Socket[0x15])();
  if ((uVar2 & 1) == 0) {
    std::weak_ptr<cppnet::CppNetBase>::lock((weak_ptr<cppnet::CppNetBase> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    if (bVar1) {
      this_02 = std::
                __shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
      this_00 = &actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::shared_ptr<cppnet::RWSocket>::shared_ptr
                ((shared_ptr<cppnet::RWSocket> *)this_00,(shared_ptr<cppnet::RWSocket> *)local_28);
      CppNetBase::OnDisConnect
                (this_02,(shared_ptr<cppnet::RWSocket> *)this_00,
                 sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._6_2_);
      std::shared_ptr<cppnet::RWSocket>::~shared_ptr
                ((shared_ptr<cppnet::RWSocket> *)
                 &actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::shared_ptr<cppnet::CppNetBase>::~shared_ptr((shared_ptr<cppnet::CppNetBase> *)local_48);
  }
  (*(this->super_Socket)._vptr_Socket[0x14])();
  if ((this->_event != (Event *)0x0) &&
     (sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_
      != 0)) {
    Socket::GetEventActions((Socket *)local_68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
      (*peVar3->_vptr_EventActions[9])(peVar3,this->_event);
    }
    OsHandle::Close((this->super_Socket)._sock);
    std::shared_ptr<cppnet::EventActions>::~shared_ptr((shared_ptr<cppnet::EventActions> *)local_68)
    ;
  }
  std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)local_28);
  return;
}

Assistant:

void RWSocket::OnDisConnect(uint16_t err) {
    auto sock = shared_from_this();
    __all_socket_map.erase(_sock);

    if (!IsShutdown()) {
        auto cppnet_base = _cppnet_base.lock();
        if (cppnet_base) {
            cppnet_base->OnDisConnect(sock, err);
        }
    }
    SetShutdown();

    // peer disconnect or connection break.
    if (_event && err != CEC_SUCCESS) {
        auto actions = GetEventActions();
        if (actions) {
            actions->DelEvent(_event);
        }
        OsHandle::Close(_sock);
    }
}